

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O0

bool __thiscall
ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::getRequestBuffer
          (ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  reference dest;
  uint8_t local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  uint8_t data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546> *this_local;
  
  local_19 = '\f';
  pvStack_18 = buffer;
  buffer_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,9);
  dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](pvStack_18,0);
  ProtocolBase::generateBuffer(&this->super_ProtocolBase,dest,&local_19,1);
  return true;
}

Assistant:

bool getRequestBuffer(std::vector<uint8_t> &buffer) {
        uint8_t data = sizeof(Rx) * num ; //读取的话数据部分为需要读取的长度
        buffer.resize(9);
        generateBuffer(&buffer[0], &data, 1);
        return true;
    }